

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

var cs::
    make_cni<cs::numeric(&)(phmap::flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>const&)>
              (_func_numeric_flat_hash_map<cs_impl::any,_cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>_ptr
               *func,types type)

{
  proxy *in_RDI;
  proxy *this;
  types *in_stack_ffffffffffffffd0;
  cni *in_stack_ffffffffffffffd8;
  
  this = in_RDI;
  cs_impl::cni::
  cni<cs::numeric(&)(phmap::flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>const&)>
            ((cni *)in_RDI,
             (_func_numeric_flat_hash_map<cs_impl::any,_cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>_ptr
              *)in_RDI);
  cs_impl::any::make_protect<cs::callable,cs_impl::cni,cs::callable::types&>
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  cs_impl::cni::~cni((cni *)this);
  return (var)in_RDI;
}

Assistant:

var make_cni(T &&func, callable::types type)
	{
		return var::make_protect<callable>(cni(func), type);
	}